

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chrometracer.cpp
# Opt level: O3

void __thiscall
CChromeTracer::writeDeviceTiming
          (CChromeTracer *this,char *name,uint64_t startTime,uint64_t endTime,uint64_t id)

{
  long lVar1;
  undefined4 uVar3;
  undefined1 auVar2 [16];
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  
  uVar3 = (undefined4)(startTime >> 0x20);
  if (this->m_AddFlowEvents == false) {
    auVar5._8_4_ = uVar3;
    auVar5._0_8_ = startTime;
    auVar5._12_4_ = 0x45300000;
    dVar4 = ((auVar5._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)startTime) - 4503599627370496.0)) / 1000.0;
  }
  else {
    auVar2._8_4_ = uVar3;
    auVar2._0_8_ = startTime;
    auVar2._12_4_ = 0x45300000;
    dVar4 = ((auVar2._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)startTime) - 4503599627370496.0)) / 1000.0;
    snprintf(this->m_StringBuffer,0x4000,
             "{\"ph\":\"f\",\"pid\":%lu,\"tid\":\"%s\",\"name\":\"Command\",\"cat\":\"Commands\",\"ts\":%.3f,\"id\":%lu},\n"
             ,dVar4,this->m_ProcessId,name,id);
    std::ostream::write((char *)&this->m_TraceFile,(long)this->m_StringBuffer);
  }
  lVar1 = endTime - startTime;
  auVar6._8_4_ = (int)((ulong)lVar1 >> 0x20);
  auVar6._0_8_ = lVar1;
  auVar6._12_4_ = 0x45300000;
  snprintf(this->m_StringBuffer,0x4000,
           "{\"ph\":\"X\",\"pid\":%lu,\"tid\":\"%s\",\"name\":\"%s\",\"ts\":%.3f,\"dur\":%.3f,\"args\":{\"id\":%lu}},\n"
           ,dVar4,((auVar6._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0)) / 1000.0,
           this->m_ProcessId,name,name,id);
  std::ostream::write((char *)&this->m_TraceFile,(long)this->m_StringBuffer);
  return;
}

Assistant:

void CChromeTracer::writeDeviceTiming(
    const char* name,
    uint64_t startTime,
    uint64_t endTime,
    uint64_t id )
{
    if( m_AddFlowEvents )
    {
        int size = CLI_SPRINTF(m_StringBuffer, CLI_STRING_BUFFER_SIZE,
            "{\"ph\":\"f\",\"pid\":%" PRIu64 ",\"tid\":\"%s\",\"name\":\"Command\""
            ",\"cat\":\"Commands\",\"ts\":%.3f,\"id\":%" PRIu64 "},\n",
            m_ProcessId,
            name,
            startTime / 1000.0,
            id );
        m_TraceFile.write(m_StringBuffer, size);
    }

    int size = CLI_SPRINTF(m_StringBuffer, CLI_STRING_BUFFER_SIZE,
        "{\"ph\":\"X\",\"pid\":%" PRIu64 ",\"tid\":\"%s\",\"name\":\"%s\""
        ",\"ts\":%.3f,\"dur\":%.3f,\"args\":{\"id\":%" PRIu64 "}},\n",
        m_ProcessId,
        name,
        name,
        startTime / 1000.0,
        (endTime - startTime) / 1000.0,
        id );
    m_TraceFile.write(m_StringBuffer, size);
}